

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::readArray(Reader *this,Token *param_1)

{
  bool bVar1;
  byte *pbVar2;
  _Elt_pointer ppVVar3;
  int index;
  byte bVar4;
  Token endArray;
  Token token;
  ValueHolder local_68 [2];
  long local_58 [2];
  Token local_48;
  
  Value::Value((Value *)local_68,arrayValue);
  ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar3 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::operator=(ppVVar3[-1],(Value *)local_68);
  Value::~Value((Value *)local_68);
  pbVar2 = (byte *)this->current_;
  while (pbVar2 != (byte *)this->end_) {
    bVar4 = *pbVar2;
    if ((0x20 < (ulong)bVar4) || ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) == 0))
    goto LAB_00142a65;
    pbVar2 = pbVar2 + 1;
    this->current_ = (Location)pbVar2;
  }
  bVar4 = *pbVar2;
LAB_00142a65:
  if (bVar4 == 0x5d) {
    readToken(this,(Token *)local_68);
LAB_00142a76:
    bVar1 = true;
  }
  else {
    index = 0;
    do {
      ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar3 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      local_68[0].map_ = (ObjectValues *)Value::operator[](ppVVar3[-1],index);
      std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
                ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,
                 (Value **)&local_68[0].map_);
      bVar1 = readValue(this);
      std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
                ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
      if (!bVar1) {
        recoverFromError(this,tokenArrayEnd);
        goto LAB_00142b4c;
      }
      index = index + 1;
      do {
        readToken(this,&local_48);
      } while (local_48.type_ == tokenComment);
      if (local_48.type_ == tokenArrayEnd) goto LAB_00142a76;
    } while (local_48.type_ == tokenArraySeparator);
    local_68[0].string_ = (char *)local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"Missing \',\' or \']\' in array declaration","");
    addError(this,(string *)local_68,&local_48,(Location)0x0);
    recoverFromError(this,tokenArrayEnd);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0].string_,local_58[0] + 1);
    }
LAB_00142b4c:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool 
Reader::readArray( Token &/*tokenStart*/ )
{
   currentValue() = Value( arrayValue );
   skipSpaces();
   if ( *current_ == ']' ) // empty array
   {
      Token endArray;
      readToken( endArray );
      return true;
   }
   int index = 0;
   for (;;)
   {
      Value &value = currentValue()[ index++ ];
      nodes_.push( &value );
      bool ok = readValue();
      nodes_.pop();
      if ( !ok ) // error already set
         return recoverFromError( tokenArrayEnd );

      Token token;
      // Accept Comment after last item in the array.
      ok = readToken( token );
      while ( token.type_ == tokenComment  &&  ok )
      {
         ok = readToken( token );
      }
      bool badTokenType = ( token.type_ != tokenArraySeparator  &&
                            token.type_ != tokenArrayEnd );
      if ( !ok  ||  badTokenType )
      {
         return addErrorAndRecover( "Missing ',' or ']' in array declaration", 
                                    token, 
                                    tokenArrayEnd );
      }
      if ( token.type_ == tokenArrayEnd )
         break;
   }
   return true;
}